

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O3

bool AbslInternalPerThreadSemWait(KernelTimeout t)

{
  int iVar1;
  atomic<int> *paVar2;
  bool bVar3;
  ThreadIdentity *pTVar4;
  
  pTVar4 = absl::base_internal::CurrentThreadIdentityIfPresent();
  if (pTVar4 == (ThreadIdentity *)0x0) {
    pTVar4 = absl::synchronization_internal::CreateThreadIdentity();
  }
  iVar1 = (pTVar4->ticker).super___atomic_base<int>._M_i;
  (pTVar4->wait_start).super___atomic_base<int>._M_i = iVar1 + (uint)(iVar1 == 0);
  (pTVar4->is_idle)._M_base._M_i = false;
  paVar2 = pTVar4->blocked_count_ptr;
  if (paVar2 != (atomic<int> *)0x0) {
    LOCK();
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  bVar3 = absl::synchronization_internal::FutexWaiter::Wait((FutexWaiter *)&pTVar4->waiter_state,t);
  paVar2 = pTVar4->blocked_count_ptr;
  if (paVar2 != (atomic<int> *)0x0) {
    LOCK();
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  (pTVar4->is_idle)._M_base._M_i = false;
  (pTVar4->wait_start).super___atomic_base<int>._M_i = 0;
  return bVar3;
}

Assistant:

ABSL_ATTRIBUTE_WEAK bool ABSL_INTERNAL_C_SYMBOL(AbslInternalPerThreadSemWait)(
    absl::synchronization_internal::KernelTimeout t) {
  bool timeout = false;
  absl::base_internal::ThreadIdentity *identity;
  identity = absl::synchronization_internal::GetOrCreateCurrentThreadIdentity();

  // Ensure wait_start != 0.
  int ticker = identity->ticker.load(std::memory_order_relaxed);
  identity->wait_start.store(ticker ? ticker : 1, std::memory_order_relaxed);
  identity->is_idle.store(false, std::memory_order_relaxed);

  if (identity->blocked_count_ptr != nullptr) {
    // Increment count of threads blocked in a given thread pool.
    identity->blocked_count_ptr->fetch_add(1, std::memory_order_relaxed);
  }

  timeout =
      !absl::synchronization_internal::Waiter::GetWaiter(identity)->Wait(t);

  if (identity->blocked_count_ptr != nullptr) {
    identity->blocked_count_ptr->fetch_sub(1, std::memory_order_relaxed);
  }

  identity->is_idle.store(false, std::memory_order_relaxed);
  identity->wait_start.store(0, std::memory_order_relaxed);
  return !timeout;
}